

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool __thiscall AActor::IsInsideVisibleAngles(AActor *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double y;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double x;
  double dVar7;
  double dVar8;
  double y_00;
  double dVar9;
  
  if (((this->renderflags).Value & 0x200000) != 0) {
    if ((&DAT_017e5fc8)[(long)consoleplayer * 0x54] != 0) {
      if ((*(byte *)((&DAT_017e5fc8)[(long)consoleplayer * 0x54] + 0x20) & 0x20) == 0) {
        lVar3 = (&DAT_017e5fc8)[(long)consoleplayer * 0x54];
        if (lVar3 == 0) {
          return true;
        }
        if ((*(byte *)(lVar3 + 0x20) & 0x20) == 0) {
          dVar1 = (this->VisibleEndAngle).Degrees;
          dVar7 = (this->VisibleStartAngle).Degrees;
          dVar8 = (this->VisibleStartPitch).Degrees;
          dVar2 = (this->VisibleEndPitch).Degrees;
          x = ViewPos.X - (this->__Pos).X;
          y = ViewPos.Y - (this->__Pos).Y;
          dVar9 = dVar1;
          if (dVar7 <= dVar1) {
            dVar9 = dVar7;
          }
          y_00 = ViewPos.Z - (this->__Pos).Z;
          dVar4 = c_atan2(y,x);
          dVar4 = dVar4 * 57.29577951308232;
          if (((this->renderflags).Value & 0x400000) == 0) {
            dVar4 = (double)SUB84((dVar4 - (this->Angles).Yaw.Degrees) * 11930464.711111112 +
                                  6755399441055744.0,0) * 8.381903171539307e-08;
          }
          if (dVar4 < dVar9) {
            return false;
          }
          if (dVar7 <= dVar1) {
            dVar7 = dVar1;
          }
          if (dVar7 < dVar4) {
            return false;
          }
          uVar5 = SUB84(dVar2,0);
          uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
          if (dVar8 <= dVar2) {
            uVar5 = SUB84(dVar8,0);
            uVar6 = (undefined4)((ulong)dVar8 >> 0x20);
          }
          dVar1 = c_sqrt(y * y + x * x);
          dVar1 = c_atan2(y_00,dVar1);
          dVar1 = dVar1 * 57.29577951308232;
          if (((this->renderflags).Value & 0x800000) == 0) {
            dVar1 = (double)SUB84((dVar1 - (this->Angles).Pitch.Degrees) * 11930464.711111112 +
                                  6755399441055744.0,0) * 8.381903171539307e-08;
          }
          if (dVar1 < (double)CONCAT44(uVar6,uVar5)) {
            return false;
          }
          if (dVar8 <= dVar2) {
            dVar8 = dVar2;
          }
          return dVar1 <= dVar8;
        }
      }
      (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
    }
  }
  return true;
}

Assistant:

bool AActor::IsInsideVisibleAngles() const
{
	// Don't bother masking if not wanted.
	if (!(renderflags & RF_MASKROTATION))
		return true;

	if (players[consoleplayer].camera == nullptr)
		return true;
	
	DAngle anglestart = VisibleStartAngle;
	DAngle angleend = VisibleEndAngle;
	DAngle pitchstart = VisibleStartPitch;
	DAngle pitchend = VisibleEndPitch;
	
	if (anglestart > angleend)
	{
		DAngle temp = anglestart;
		anglestart = angleend;
		angleend = temp;
	}

	if (pitchstart > pitchend)
	{
		DAngle temp = pitchstart;
		pitchstart = pitchend;
		pitchend = temp;
	}
	

	AActor *mo = players[consoleplayer].camera;

	if (mo != nullptr)
	{
		
		DVector3 diffang = ViewPos - Pos();
		DAngle to = diffang.Angle();

		if (!(renderflags & RF_ABSMASKANGLE)) 
			to = deltaangle(Angles.Yaw, to);

		if ((to >= anglestart && to <= angleend))
		{
			to = diffang.Pitch();
			if (!(renderflags & RF_ABSMASKPITCH))
				to = deltaangle(Angles.Pitch, to);

			return !!(to >= pitchstart && to <= pitchend);
		}
		else return false;
	}
	return true;
}